

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O1

RealType __thiscall OpenMD::SelectionEvaluator::getCharge(SelectionEvaluator *this,Atom *atom)

{
  AtomType *pAVar1;
  bool bVar2;
  RealType RVar3;
  FixedChargeAdapter fca;
  FluctuatingChargeAdapter fqa;
  FixedChargeAdapter local_20;
  FluctuatingChargeAdapter local_18;
  
  pAVar1 = atom->atomType_;
  local_20.at_ = pAVar1;
  bVar2 = FixedChargeAdapter::isFixedCharge(&local_20);
  RVar3 = 0.0;
  if (bVar2) {
    RVar3 = FixedChargeAdapter::getCharge(&local_20);
  }
  local_18.at_ = pAVar1;
  bVar2 = FluctuatingChargeAdapter::isFluctuatingCharge(&local_18);
  if (bVar2) {
    RVar3 = RVar3 + *(double *)
                     (*(long *)((long)&(((atom->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                       atomData).flucQPos.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_start +
                               (atom->super_StuntDouble).storage_) +
                     (long)(atom->super_StuntDouble).localIndex_ * 8);
  }
  return RVar3;
}

Assistant:

RealType SelectionEvaluator::getCharge(Atom* atom) {
    RealType charge    = 0.0;
    AtomType* atomType = atom->getAtomType();

    FixedChargeAdapter fca = FixedChargeAdapter(atomType);
    if (fca.isFixedCharge()) { charge = fca.getCharge(); }

    FluctuatingChargeAdapter fqa = FluctuatingChargeAdapter(atomType);
    if (fqa.isFluctuatingCharge()) { charge += atom->getFlucQPos(); }
    return charge;
  }